

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_scan.cpp
# Opt level: O2

vector<duckdb::PartitionStatistics,_true> *
duckdb::TableScanGetPartitionStats
          (vector<duckdb::PartitionStatistics,_true> *__return_storage_ptr__,ClientContext *context,
          GetPartitionStatsInput *input)

{
  FunctionData *pFVar1;
  DataTable *this;
  vector<duckdb::PartitionStatistics,_true> result;
  _Vector_base<duckdb::PartitionStatistics,_std::allocator<duckdb::PartitionStatistics>_> local_28;
  
  pFVar1 = optional_ptr<const_duckdb::FunctionData,_true>::operator->(&input->bind_data);
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this = (DataTable *)(**(code **)(*pFVar1[4]._vptr_FunctionData + 0x80))();
  DataTable::GetPartitionStats(__return_storage_ptr__,this,context);
  ::std::_Vector_base<duckdb::PartitionStatistics,_std::allocator<duckdb::PartitionStatistics>_>::
  ~_Vector_base(&local_28);
  return __return_storage_ptr__;
}

Assistant:

vector<PartitionStatistics> TableScanGetPartitionStats(ClientContext &context, GetPartitionStatsInput &input) {
	auto &bind_data = input.bind_data->Cast<TableScanBindData>();
	vector<PartitionStatistics> result;
	auto &duck_table = bind_data.table.Cast<DuckTableEntry>();
	auto &storage = duck_table.GetStorage();
	return storage.GetPartitionStats(context);
}